

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp_rect_pack.h
# Opt level: O3

bool __thiscall
dp::rect_pack::RectPacker<int>::Page::tryGrow(Page *this,Context *ctx,Size *rect,Position *pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (ctx->maxSize).w;
  iVar2 = (this->rootSize).w;
  iVar6 = iVar1 - iVar2;
  if (iVar1 < iVar2) {
    __assert_fail("ctx.maxSize.w >= rootSize.w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/dp_rect_pack.h"
                  ,499,
                  "bool dp::rect_pack::RectPacker<>::Page::tryGrow(Context &, const Size &, Position &) [GeomT = int]"
                 );
  }
  iVar1 = (ctx->maxSize).h;
  iVar3 = (this->rootSize).h;
  iVar5 = iVar1 - iVar3;
  if (iVar1 < iVar3) {
    __assert_fail("ctx.maxSize.h >= rootSize.h",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/dp_rect_pack.h"
                  ,0x1f5,
                  "bool dp::rect_pack::RectPacker<>::Page::tryGrow(Context &, const Size &, Position &) [GeomT = int]"
                 );
  }
  iVar1 = rect->h;
  iVar4 = (ctx->spacing).y;
  if (iVar5 - iVar1 < iVar4 || iVar5 < iVar1) {
    if (iVar6 < rect->w) {
      return false;
    }
    if (iVar6 - rect->w < (ctx->spacing).x) {
      return false;
    }
  }
  else {
    iVar5 = (ctx->spacing).x;
    if (((iVar5 <= iVar6) && (iVar1 + iVar3 + iVar4 <= iVar2 + iVar5)) ||
       (iVar6 < rect->w || iVar6 - rect->w < iVar5)) {
      growDown(this,ctx,rect,pos);
      return true;
    }
  }
  growRight(this,ctx,rect,pos);
  return true;
}

Assistant:

bool RectPacker<GeomT>::Page::tryGrow(
    Context& ctx, const Size& rect, Position& pos)
{
    assert(ctx.maxSize.w >= rootSize.w);
    const GeomT freeW = ctx.maxSize.w - rootSize.w;
    assert(ctx.maxSize.h >= rootSize.h);
    const GeomT freeH = ctx.maxSize.h - rootSize.h;

    const bool canGrowDown = (
        freeH >= rect.h && freeH - rect.h >= ctx.spacing.y);
    const bool mustGrowDown = (
        canGrowDown
        && freeW >= ctx.spacing.x
        && (rootSize.w + ctx.spacing.x
            >= rootSize.h + rect.h + ctx.spacing.y));
    if (mustGrowDown) {
        growDown(ctx, rect, pos);
        return true;
    }

    const bool canGrowRight = (
        freeW >= rect.w && freeW - rect.w >= ctx.spacing.x);
    if (canGrowRight) {
        growRight(ctx, rect, pos);
        return true;
    }

    if (canGrowDown) {
        growDown(ctx, rect, pos);
        return true;
    }

    return false;
}